

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O1

void asio::detail::executor_function::
     complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  undefined4 uVar1;
  _func_void_impl_base_ptr_bool *p_Var2;
  _func_void_impl_base_ptr_bool *p_Var3;
  _func_void_impl_base_ptr_bool *p_Var4;
  allocator<void> allocator;
  ptr p;
  allocator<void> local_49;
  ptr local_48;
  
  local_48.a = &local_49;
  p_Var4 = base[1].complete_;
  p_Var2 = base[2].complete_;
  p_Var3 = base[3].complete_;
  uVar1 = *(undefined4 *)&base[4].complete_;
  local_48.v = base;
  local_48.p = (impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_48);
  if (call) {
    if (((ulong)p_Var4 & 1) != 0) {
      p_Var4 = *(_func_void_impl_base_ptr_bool **)
                (p_Var4 + (long)(((impl_base *)(p_Var3 + (long)p_Var2))->complete_ + -1));
    }
    (*p_Var4)((impl_base *)(p_Var3 + (long)p_Var2),SUB41(uVar1,0));
  }
  impl<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_48);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }